

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O1

void __thiscall CppUnit::TestPath::removeTest(TestPath *this,int index)

{
  ulong uVar1;
  ulong uVar2;
  iterator local_50;
  iterator local_30;
  
  checkIndexValid(this,index);
  local_30._M_cur =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_30._M_node =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar1 = ((long)local_30._M_cur -
           (long)(this->m_tests).
                 super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + (long)index;
  if (uVar1 < 0x40) {
    local_30._M_cur = local_30._M_cur + index;
  }
  else {
    uVar2 = uVar1 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar1) {
      uVar2 = uVar1 >> 6;
    }
    local_30._M_node = local_30._M_node + uVar2;
    local_30._M_cur = *local_30._M_node + uVar1 + uVar2 * -0x40;
  }
  local_30._M_first = *local_30._M_node;
  local_30._M_last = local_30._M_first + 0x40;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::_M_erase
            (&local_50,&this->m_tests,&local_30);
  return;
}

Assistant:

void 
TestPath::removeTest( int index )
{
  checkIndexValid( index );
  m_tests.erase( m_tests.begin() + index );
}